

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_writer_create_central_dir_header
                  (mz_zip_archive *pZip,mz_uint8 *pDst,mz_uint16 filename_size,mz_uint16 extra_size,
                  mz_uint16 comment_size,mz_uint64 uncomp_size,mz_uint64 comp_size,
                  mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,mz_uint16 dos_time,
                  mz_uint16 dos_date,mz_uint64 param_13,mz_uint32 ext_attributes)

{
  mz_uint8 mVar1;
  undefined4 local_138;
  mz_uint64 local_128;
  undefined4 local_118;
  mz_uint64 uncomp_size_local;
  mz_uint16 comment_size_local;
  mz_uint16 extra_size_local;
  mz_uint16 filename_size_local;
  mz_uint8 *pDst_local;
  mz_zip_archive *pZip_local;
  
  memset(pDst,0,0x2e);
  builtin_memcpy(pDst,"PK\x01\x02",4);
  mVar1 = '\0';
  if (method != 0) {
    mVar1 = '\x14';
  }
  pDst[6] = mVar1;
  pDst[7] = '\0';
  *(mz_uint16 *)(pDst + 8) = bit_flags;
  *(mz_uint16 *)(pDst + 10) = method;
  *(mz_uint16 *)(pDst + 0xc) = dos_time;
  *(mz_uint16 *)(pDst + 0xe) = dos_date;
  pDst[0x10] = (mz_uint8)uncomp_crc32;
  pDst[0x11] = (mz_uint8)(uncomp_crc32 >> 8);
  pDst[0x12] = (mz_uint8)(uncomp_crc32 >> 0x10);
  pDst[0x13] = (mz_uint8)(uncomp_crc32 >> 0x18);
  if (comp_size < 0xffffffff) {
    local_118 = (undefined4)comp_size;
  }
  else {
    local_118 = 0xffffffff;
  }
  pDst[0x14] = (mz_uint8)local_118;
  pDst[0x15] = (mz_uint8)((uint)local_118 >> 8);
  pDst[0x16] = (mz_uint8)((uint)local_118 >> 0x10);
  pDst[0x17] = (mz_uint8)((uint)local_118 >> 0x18);
  local_128 = uncomp_size;
  if (0xfffffffe < uncomp_size) {
    local_128 = 0xffffffff;
  }
  pDst[0x18] = (mz_uint8)local_128;
  pDst[0x19] = (mz_uint8)(local_128 >> 8);
  pDst[0x1a] = (mz_uint8)(local_128 >> 0x10);
  pDst[0x1b] = (mz_uint8)(local_128 >> 0x18);
  *(mz_uint16 *)(pDst + 0x1c) = filename_size;
  *(mz_uint16 *)(pDst + 0x1e) = extra_size;
  *(mz_uint16 *)(pDst + 0x20) = comment_size;
  pDst[0x26] = (mz_uint8)ext_attributes;
  pDst[0x27] = (mz_uint8)(ext_attributes >> 8);
  pDst[0x28] = (mz_uint8)(ext_attributes >> 0x10);
  pDst[0x29] = (mz_uint8)(ext_attributes >> 0x18);
  if (param_13 < 0xffffffff) {
    local_138 = (undefined4)param_13;
  }
  else {
    local_138 = 0xffffffff;
  }
  pDst[0x2a] = (mz_uint8)local_138;
  pDst[0x2b] = (mz_uint8)((uint)local_138 >> 8);
  pDst[0x2c] = (mz_uint8)((uint)local_138 >> 0x10);
  pDst[0x2d] = (mz_uint8)((uint)local_138 >> 0x18);
  return 1;
}

Assistant:

static mz_bool mz_zip_writer_create_central_dir_header(mz_zip_archive *pZip, mz_uint8 *pDst,
                                                       mz_uint16 filename_size, mz_uint16 extra_size, mz_uint16 comment_size,
                                                       mz_uint64 uncomp_size, mz_uint64 comp_size, mz_uint32 uncomp_crc32,
                                                       mz_uint16 method, mz_uint16 bit_flags, mz_uint16 dos_time, mz_uint16 dos_date,
                                                       mz_uint64 local_header_ofs, mz_uint32 ext_attributes)
{
    (void)pZip;
    memset(pDst, 0, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);
    MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_SIG_OFS, MZ_ZIP_CENTRAL_DIR_HEADER_SIG);
    MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_VERSION_NEEDED_OFS, method ? 20 : 0);
    MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_BIT_FLAG_OFS, bit_flags);
    MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_METHOD_OFS, method);
    MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_FILE_TIME_OFS, dos_time);
    MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_FILE_DATE_OFS, dos_date);
    MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_CRC32_OFS, uncomp_crc32);
    MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_MIN(comp_size, MZ_UINT32_MAX));
    MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_MIN(uncomp_size, MZ_UINT32_MAX));
    MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_FILENAME_LEN_OFS, filename_size);
    MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_EXTRA_LEN_OFS, extra_size);
    MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_COMMENT_LEN_OFS, comment_size);
    MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS, ext_attributes);
    MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_MIN(local_header_ofs, MZ_UINT32_MAX));
    return MZ_TRUE;
}